

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  undefined8 uVar1;
  int iVar2;
  mapped_type *pmVar3;
  runtime_error *this_01;
  long *plVar4;
  long *plVar5;
  long *in_RDX;
  char *pcVar6;
  string id;
  undefined1 local_b0 [32];
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this_00 = (XML *)*in_RDX;
  local_b0._0_8_ = (Node *)(local_b0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"id","");
  XML::parm(&local_90,this_00,(string *)local_b0);
  if ((Node *)local_b0._0_8_ != (Node *)(local_b0 + 0x10)) {
    operator_delete((void *)local_b0._0_8_);
  }
  pcVar6 = "PointLight";
  iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
  if (iVar2 == 0) {
    loadPointLight((XMLLoader *)local_b0,(Ref<embree::XML> *)pcVar6);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent,&local_90);
    if (pmVar3->ptr != (Node *)0x0) {
      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    uVar1 = local_b0._0_8_;
    pmVar3->ptr = (Node *)local_b0._0_8_;
    local_b0._0_8_ = (pointer)0x0;
    (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
    if ((Node *)uVar1 != (Node *)0x0) {
      (**(code **)(*(long *)uVar1 + 0x10))();
    }
  }
  else {
    pcVar6 = "SpotLight";
    iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
    if (iVar2 == 0) {
      loadSpotLight((XMLLoader *)local_b0,(Ref<embree::XML> *)pcVar6);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,&local_90);
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      uVar1 = local_b0._0_8_;
      pmVar3->ptr = (Node *)local_b0._0_8_;
      local_b0._0_8_ = (pointer)0x0;
      (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
      if ((Node *)uVar1 != (Node *)0x0) {
        (**(code **)(*(long *)uVar1 + 0x10))();
      }
    }
    else {
      pcVar6 = "DirectionalLight";
      iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
      if (iVar2 == 0) {
        loadDirectionalLight((XMLLoader *)local_b0,(Ref<embree::XML> *)pcVar6);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,&local_90);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        uVar1 = local_b0._0_8_;
        pmVar3->ptr = (Node *)local_b0._0_8_;
        local_b0._0_8_ = (pointer)0x0;
        (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
        if ((Node *)uVar1 != (Node *)0x0) {
          (**(code **)(*(long *)uVar1 + 0x10))();
        }
      }
      else {
        pcVar6 = "DistantLight";
        iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
        if (iVar2 == 0) {
          loadDistantLight((XMLLoader *)local_b0,(Ref<embree::XML> *)pcVar6);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_parent,&local_90);
          if (pmVar3->ptr != (Node *)0x0) {
            (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          uVar1 = local_b0._0_8_;
          pmVar3->ptr = (Node *)local_b0._0_8_;
          local_b0._0_8_ = (pointer)0x0;
          (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
          if ((Node *)uVar1 != (Node *)0x0) {
            (**(code **)(*(long *)uVar1 + 0x10))();
          }
        }
        else {
          pcVar6 = "AmbientLight";
          iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
          if (iVar2 == 0) {
            loadAmbientLight((XMLLoader *)local_b0,(Ref<embree::XML> *)pcVar6);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                   *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent,&local_90);
            if (pmVar3->ptr != (Node *)0x0) {
              (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
            }
            uVar1 = local_b0._0_8_;
            pmVar3->ptr = (Node *)local_b0._0_8_;
            local_b0._0_8_ = (pointer)0x0;
            (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
            if ((Node *)uVar1 != (Node *)0x0) {
              (**(code **)(*(long *)uVar1 + 0x10))();
            }
          }
          else {
            pcVar6 = "TriangleLight";
            iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
            if (iVar2 == 0) {
              loadTriangleLight((XMLLoader *)local_b0,(Ref<embree::XML> *)pcVar6);
              pmVar3 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                     *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent,&local_90);
              if (pmVar3->ptr != (Node *)0x0) {
                (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
              }
              uVar1 = local_b0._0_8_;
              pmVar3->ptr = (Node *)local_b0._0_8_;
              local_b0._0_8_ = (pointer)0x0;
              (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
              if ((Node *)uVar1 != (Node *)0x0) {
                (**(code **)(*(long *)uVar1 + 0x10))();
              }
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
              if (iVar2 == 0) {
                loadAnimatedLight((XMLLoader *)local_b0,xml);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                       *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent,&local_90);
                if (pmVar3->ptr != (Node *)0x0) {
                  (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
                }
                uVar1 = local_b0._0_8_;
                pmVar3->ptr = (Node *)local_b0._0_8_;
                local_b0._0_8_ = (pointer)0x0;
                (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
                if ((Node *)uVar1 != (Node *)0x0) {
                  (**(code **)(*(long *)uVar1 + 0x10))();
                }
              }
              else {
                pcVar6 = "QuadLight";
                iVar2 = std::__cxx11::string::compare((char *)(*in_RDX + 0x30));
                if (iVar2 != 0) {
                  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(*in_RDX + 0x10));
                  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
                  local_70._M_dataplus._M_p = (pointer)*plVar4;
                  plVar5 = plVar4 + 2;
                  if ((long *)local_70._M_dataplus._M_p == plVar5) {
                    local_70.field_2._M_allocated_capacity = *plVar5;
                    local_70.field_2._8_8_ = plVar4[3];
                    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                  }
                  else {
                    local_70.field_2._M_allocated_capacity = *plVar5;
                  }
                  local_70._M_string_length = plVar4[1];
                  *plVar4 = (long)plVar5;
                  plVar4[1] = 0;
                  *(undefined1 *)(plVar4 + 2) = 0;
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_b0,&local_70,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(*in_RDX + 0x30));
                  std::runtime_error::runtime_error(this_01,(string *)local_b0);
                  __cxa_throw(this_01,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                loadQuadLight((XMLLoader *)local_b0,(Ref<embree::XML> *)pcVar6);
                pmVar3 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                                       *)&((xml[10].ptr)->parms)._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_parent,&local_90);
                if (pmVar3->ptr != (Node *)0x0) {
                  (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
                }
                uVar1 = local_b0._0_8_;
                pmVar3->ptr = (Node *)local_b0._0_8_;
                local_b0._0_8_ = (pointer)0x0;
                (this->path).filename._M_dataplus._M_p = (pointer)uVar1;
                if ((Node *)uVar1 != (Node *)0x0) {
                  (**(code **)(*(long *)uVar1 + 0x10))();
                }
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadLight(const Ref<XML>& xml) 
   {
     const std::string id = xml->parm("id");
     if      (xml->name == "PointLight"      ) return state.sceneMap[id] = loadPointLight      (xml);
     else if (xml->name == "SpotLight"       ) return state.sceneMap[id] = loadSpotLight       (xml);
     else if (xml->name == "DirectionalLight") return state.sceneMap[id] = loadDirectionalLight(xml);
     else if (xml->name == "DistantLight"    ) return state.sceneMap[id] = loadDistantLight    (xml);
     else if (xml->name == "AmbientLight"    ) return state.sceneMap[id] = loadAmbientLight    (xml);
     else if (xml->name == "TriangleLight"   ) return state.sceneMap[id] = loadTriangleLight   (xml);
     else if (xml->name == "AnimatedLight"   ) return state.sceneMap[id] = loadAnimatedLight   (xml);
     else if (xml->name == "QuadLight"       ) return state.sceneMap[id] = loadQuadLight       (xml);
     else THROW_RUNTIME_ERROR(xml->loc.str()+": invalid light node: "+xml->name);
   }